

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_418bcd::RSTFormatter::Write(RSTFormatter *this,CStringRef s)

{
  Buffer<char> *pBVar1;
  byte bVar2;
  int iVar3;
  byte *__src;
  size_t sVar4;
  ulong uVar5;
  char *str;
  size_t __n;
  
  do {
    do {
      __src = (byte *)s.data_;
      bVar2 = *__src;
      s.data_ = (char *)(__src + 1);
    } while (bVar2 == 0x20);
    __n = 0;
    while ((0x20 < bVar2 || ((0x100000401U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
      bVar2 = __src[__n + 1];
      __n = __n + 1;
    }
    iVar3 = this->pos_in_line_;
    if (0x4e < (long)((((long)iVar3 + 1) - (ulong)((long)iVar3 == 0)) + __n)) {
      EndLine(this);
      iVar3 = this->pos_in_line_;
    }
    if (iVar3 == 0) {
      Indent(this);
    }
    else {
      pBVar1 = this->writer_->buffer_;
      sVar4 = pBVar1->size_;
      if (sVar4 == pBVar1->capacity_) {
        (**pBVar1->_vptr_Buffer)(pBVar1,sVar4 + 1);
        sVar4 = pBVar1->size_;
      }
      pBVar1->size_ = sVar4 + 1;
      pBVar1->ptr_[sVar4] = ' ';
      this->pos_in_line_ = this->pos_in_line_ + 1;
    }
    pBVar1 = this->writer_->buffer_;
    uVar5 = pBVar1->size_ + __n;
    if (pBVar1->capacity_ < uVar5) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
    }
    if (__n != 0) {
      memmove(pBVar1->ptr_ + pBVar1->size_,__src,__n);
    }
    pBVar1->size_ = uVar5;
    this->pos_in_line_ = this->pos_in_line_ + (int)__n;
    s.data_ = (char *)(__src + __n);
    bVar2 = *s.data_;
    if (bVar2 == 10) {
      EndLine(this);
      s.data_ = (char *)(__src + __n + 1);
      bVar2 = *s.data_;
    }
  } while (bVar2 != 0);
  return;
}

Assistant:

void RSTFormatter::Write(fmt::CStringRef s) {
  enum { MAX_LINE_LENGTH = 78 };
  const char *p = s.c_str();
  for (;;) {
    // Skip leading spaces.
    while (*p == ' ')
      ++p;
    const char *word_start = p;
    while (*p != ' ' && *p != '\n' && *p)
      ++p;
    const char *word_end = p;
    if (pos_in_line_ + (word_end - word_start) +
        (pos_in_line_ == 0 ? 0 : 1) > MAX_LINE_LENGTH) {
      EndLine();  // The word doesn't fit in the current line, start a new one.
    }
    if (pos_in_line_ == 0) {
      Indent();
    } else {
      // Separate words.
      writer_ << ' ';
      ++pos_in_line_;
    }
    std::size_t length = word_end - word_start;
    writer_ << fmt::StringRef(word_start, length);
    pos_in_line_ += static_cast<int>(length);
    if (*p == '\n') {
      EndLine();
      ++p;
    }
    if (!*p) break;
  }
}